

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cppillr.cpp
# Opt level: O1

void show_includes(LexData *data)

{
  int iVar1;
  pointer puVar2;
  pointer pTVar3;
  int iVar4;
  char *pcVar5;
  int iVar6;
  uint uVar7;
  ulong uVar8;
  long lVar9;
  long lVar10;
  vector<PPIf,_std::allocator<PPIf>_> stack;
  string id;
  PPIf ppif;
  vector<PPIf,_std::allocator<PPIf>_> local_98;
  long *local_78 [2];
  long local_68 [2];
  value_type local_58;
  
  local_98.super__Vector_base<PPIf,_std::allocator<PPIf>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)0x0;
  local_98.super__Vector_base<PPIf,_std::allocator<PPIf>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  local_98.super__Vector_base<PPIf,_std::allocator<PPIf>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  printf("%s: includes\n",(data->fn)._M_dataplus._M_p);
  pTVar3 = (data->tokens).super__Vector_base<Token,_std::allocator<Token>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (2 < (int)((ulong)((long)(data->tokens).super__Vector_base<Token,_std::allocator<Token>_>.
                              _M_impl.super__Vector_impl_data._M_finish - (long)pTVar3) >> 2) *
          -0x33333333) {
    uVar7 = 2;
    iVar6 = 0;
    do {
      if ((pTVar3[iVar6].kind == PPBegin) && (iVar4 = iVar6 + 1, pTVar3[iVar4].kind == PPKeyword)) {
        iVar1 = pTVar3[iVar4].i;
        if (iVar1 - 5U < 3) {
          local_58.id._M_dataplus._M_p = (pointer)&local_58.id.field_2;
          local_58.id._M_string_length = 0;
          local_58.id.field_2._M_local_buf[0] = '\0';
          if (pTVar3[iVar4].i - 6U < 2) {
            puVar2 = (data->ids).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_start;
            local_78[0] = local_68;
            std::__cxx11::string::
            _M_construct<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                      ((string *)local_78,puVar2 + pTVar3[(int)uVar7].i,
                       puVar2 + pTVar3[(int)uVar7].j);
            std::__cxx11::string::_M_assign((string *)&local_58);
            local_58.def = (data->tokens).super__Vector_base<Token,_std::allocator<Token>_>._M_impl.
                           super__Vector_impl_data._M_start[iVar4].i == 6;
            if (local_78[0] != local_68) {
              operator_delete(local_78[0],local_68[0] + 1);
            }
          }
          else if (pTVar3[iVar4].i == 5) {
            std::__cxx11::string::_M_replace((ulong)&local_58,0,(char *)0x0,0x111118);
            pTVar3 = (data->tokens).super__Vector_base<Token,_std::allocator<Token>_>._M_impl.
                     super__Vector_impl_data._M_start;
            if ((int)uVar7 <
                (int)((ulong)((long)(data->tokens).super__Vector_base<Token,_std::allocator<Token>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)pTVar3) >> 2)
                * -0x33333333) {
              uVar8 = (ulong)(int)uVar7;
              lVar9 = uVar8 * 0x14 + 0x10;
              do {
                iVar6 = *(int *)((long)pTVar3 + lVar9 + -0x10);
                if ((iVar6 == 5) || (iVar6 == 8)) {
                  puVar2 = (data->ids).
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_start;
                  local_78[0] = local_68;
                  std::__cxx11::string::
                  _M_construct<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                            ((string *)local_78,puVar2 + *(int *)((long)pTVar3 + lVar9 + -4),
                             puVar2 + *(int *)((long)&pTVar3->kind + lVar9));
                  std::__cxx11::string::push_back((char)&local_58);
                  std::__cxx11::string::_M_append((char *)&local_58,(ulong)local_78[0]);
                  if (local_78[0] != local_68) {
                    operator_delete(local_78[0],local_68[0] + 1);
                  }
                }
                else if (iVar6 == 3) break;
                uVar8 = uVar8 + 1;
                pTVar3 = (data->tokens).super__Vector_base<Token,_std::allocator<Token>_>._M_impl.
                         super__Vector_impl_data._M_start;
                lVar9 = lVar9 + 0x14;
              } while ((long)uVar8 <
                       (long)((int)((ulong)((long)(data->tokens).
                                                  super__Vector_base<Token,_std::allocator<Token>_>.
                                                  _M_impl.super__Vector_impl_data._M_finish -
                                           (long)pTVar3) >> 2) * -0x33333333));
            }
            else {
              uVar8 = (ulong)uVar7;
            }
            iVar6 = (int)uVar8;
            std::__cxx11::string::append((char *)&local_58);
            local_58.def = true;
          }
          std::vector<PPIf,_std::allocator<PPIf>_>::push_back(&local_98,&local_58);
LAB_00103e89:
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_58.id._M_dataplus._M_p != &local_58.id.field_2) {
            operator_delete(local_58.id._M_dataplus._M_p,
                            CONCAT71(local_58.id.field_2._M_allocated_capacity._1_7_,
                                     local_58.id.field_2._M_local_buf[0]) + 1);
          }
        }
        else if (iVar1 == 3) {
          if (local_98.super__Vector_base<PPIf,_std::allocator<PPIf>_>._M_impl.
              super__Vector_impl_data._M_start !=
              local_98.super__Vector_base<PPIf,_std::allocator<PPIf>_>._M_impl.
              super__Vector_impl_data._M_finish) {
            std::vector<PPIf,_std::allocator<PPIf>_>::_M_erase
                      (&local_98,
                       local_98.super__Vector_base<PPIf,_std::allocator<PPIf>_>._M_impl.
                       super__Vector_impl_data._M_finish + -1);
          }
        }
        else if ((iVar1 == 8) && (pTVar3[(int)uVar7].kind == PPHeaderName)) {
          puVar2 = (data->ids).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_start;
          local_58.id._M_dataplus._M_p = (pointer)&local_58.id.field_2;
          std::__cxx11::string::
          _M_construct<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                    ((string *)&local_58,puVar2 + pTVar3[(int)uVar7].i,puVar2 + pTVar3[(int)uVar7].j
                    );
          printf("  %s",local_58.id._M_dataplus._M_p);
          if (local_98.super__Vector_base<PPIf,_std::allocator<PPIf>_>._M_impl.
              super__Vector_impl_data._M_start !=
              local_98.super__Vector_base<PPIf,_std::allocator<PPIf>_>._M_impl.
              super__Vector_impl_data._M_finish) {
            printf(" (");
            if (0 < (int)((ulong)((long)local_98.super__Vector_base<PPIf,_std::allocator<PPIf>_>.
                                        _M_impl.super__Vector_impl_data._M_finish -
                                 (long)local_98.super__Vector_base<PPIf,_std::allocator<PPIf>_>.
                                       _M_impl.super__Vector_impl_data._M_start) >> 3) * -0x33333333
               ) {
              lVar10 = 0;
              lVar9 = 0;
              do {
                if (lVar10 != 0) {
                  printf(" && ");
                }
                pcVar5 = "!";
                if ((&(local_98.super__Vector_base<PPIf,_std::allocator<PPIf>_>._M_impl.
                       super__Vector_impl_data._M_start)->def)[lVar10] != false) {
                  pcVar5 = "";
                }
                printf("%s%s",pcVar5,
                       *(undefined8 *)
                        ((long)&((local_98.super__Vector_base<PPIf,_std::allocator<PPIf>_>._M_impl.
                                  super__Vector_impl_data._M_start)->id)._M_dataplus._M_p + lVar10))
                ;
                lVar9 = lVar9 + 1;
                lVar10 = lVar10 + 0x28;
              } while (lVar9 < (int)((ulong)((long)local_98.
                                                  super__Vector_base<PPIf,_std::allocator<PPIf>_>.
                                                  _M_impl.super__Vector_impl_data._M_finish -
                                            (long)local_98.
                                                  super__Vector_base<PPIf,_std::allocator<PPIf>_>.
                                                  _M_impl.super__Vector_impl_data._M_start) >> 3) *
                               -0x33333333);
            }
            putchar(0x29);
          }
          putchar(10);
          goto LAB_00103e89;
        }
      }
      uVar7 = iVar6 + 3;
      pTVar3 = (data->tokens).super__Vector_base<Token,_std::allocator<Token>_>._M_impl.
               super__Vector_impl_data._M_start;
      iVar4 = (int)((ulong)((long)(data->tokens).super__Vector_base<Token,_std::allocator<Token>_>.
                                  _M_impl.super__Vector_impl_data._M_finish - (long)pTVar3) >> 2);
      iVar6 = iVar6 + 1;
    } while (SBORROW4(uVar7,iVar4 * -0x33333333) != (int)(uVar7 + iVar4 * 0x33333333) < 0);
  }
  std::vector<PPIf,_std::allocator<PPIf>_>::~vector(&local_98);
  return;
}

Assistant:

void show_includes(const LexData& data)
{
  std::vector<PPIf> stack;

  std::printf("%s: includes\n",
              data.fn.c_str());

  for (int i=0; i+2<int(data.tokens.size()); ++i) {
    if (data.tokens[i].kind == TokenKind::PPBegin &&
        data.tokens[i+1].kind == TokenKind::PPKeyword) {
      if (data.tokens[i+1].i == pp_key_if ||
          data.tokens[i+1].i == pp_key_ifdef ||
          data.tokens[i+1].i == pp_key_ifndef) {
        PPIf ppif;
        switch (data.tokens[i+1].i) {
          case pp_key_if: {
            bool first = false;
            ppif.id = "#if (";
            for (i+=2; i<int(data.tokens.size()) &&
                   data.tokens[i].kind != TokenKind::PPEnd; ++i) {
              if (data.tokens[i].kind == TokenKind::Identifier ||
                  data.tokens[i].kind == TokenKind::Literal) {
                std::string lit(data.ids.begin()+data.tokens[i].i,
                                data.ids.begin()+data.tokens[i].j);
                if (first)
                  first = false;
                else
                  ppif.id.push_back(' ');
                ppif.id += lit;
              }
            }
            ppif.id += ")";
            ppif.def = true;
            break;
          }
          case pp_key_ifndef:
          case pp_key_ifdef: {
            std::string id(data.ids.begin()+data.tokens[i+2].i,
                           data.ids.begin()+data.tokens[i+2].j);
            ppif.id = id;
            ppif.def = (data.tokens[i+1].i == pp_key_ifdef);
            break;
          }
        }
        stack.push_back(ppif);
      }
      else if (data.tokens[i+1].i == pp_key_endif) {
        if (!stack.empty())
          stack.erase(--stack.end());
      }
      else if (data.tokens[i+1].i == pp_key_include &&
               data.tokens[i+2].kind == TokenKind::PPHeaderName) {
        std::string str(data.ids.begin()+data.tokens[i+2].i,
                        data.ids.begin()+data.tokens[i+2].j);
        std::printf("  %s", str.c_str());
        if (!stack.empty()) {
          std::printf(" (");
          for (int i=0; i<int(stack.size()); ++i) {
            if (i > 0)
              std::printf(" && ");
            std::printf("%s%s",
                        stack[i].def ? "": "!",
                        stack[i].id.c_str());
          }
          std::printf(")");
        }
        std::printf("\n");
      }
    }
  }
}